

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stage3Runner.hpp
# Opt level: O1

void * __thiscall Centaurus::Stage3Runner::acquire_bank(Stage3Runner *this)

{
  int iVar1;
  void *pvVar2;
  bool bVar3;
  void *in_RAX;
  long lVar4;
  long lVar5;
  
  pvVar2 = (this->super_BaseRunner).m_sub_window;
  do {
    iVar1 = (this->super_BaseRunner).m_bank_num;
    bVar3 = 0 < iVar1;
    if (0 < iVar1) {
      lVar5 = 0;
      do {
        if (*(int *)((long)pvVar2 + lVar5 * 8 + 4) == 4) {
          if (*(int *)((long)pvVar2 + lVar5 * 8) == this->m_counter) {
            LOCK();
            *(undefined4 *)((long)pvVar2 + lVar5 * 8 + 4) = 5;
            UNLOCK();
            if (this->m_xferlistener != (TransferListener)0x0) {
              (*this->m_xferlistener)
                        ((int)lVar5,*(int *)((long)pvVar2 + lVar5 * 8),this->m_listener_context);
            }
            this->m_current_bank = (int)lVar5;
            this->m_counter = this->m_counter + 1;
            in_RAX = (void *)(lVar5 * (this->super_BaseRunner).m_bank_size +
                             (long)(this->super_BaseRunner).m_main_window);
            break;
          }
        }
        else if (*(int *)((long)pvVar2 + lVar5 * 8 + 4) == 6) {
          in_RAX = (void *)0x0;
          break;
        }
        lVar5 = lVar5 + 1;
        lVar4 = (long)(this->super_BaseRunner).m_bank_num;
        bVar3 = lVar5 < lVar4;
      } while (lVar5 < lVar4);
    }
    if (bVar3) {
      return in_RAX;
    }
  } while( true );
}

Assistant:

void *acquire_bank()
  {
    WindowBankEntry *banks = reinterpret_cast<WindowBankEntry *>(m_sub_window);
    while (true) {
      for (int i = 0; i < m_bank_num; i++) {
        if (banks[i].state == WindowBankState::Stage2_Unlocked) {
          if (banks[i].number == m_counter) {
            banks[i].state = WindowBankState::Stage3_Locked;

            if (m_xferlistener != nullptr)
              m_xferlistener(i, banks[i].number, m_listener_context);

            //std::cout << "Bank " << banks[i].number << " reached Stage3" << std::endl;

            m_current_bank = i;
            m_counter++;
            return (char *)m_main_window + m_bank_size * i;
          }
        } else if (banks[i].state == WindowBankState::YouAreDone) {
          return NULL;
        }
      }
    }
  }